

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.h
# Opt level: O2

Clause * Reason_new(int sz)

{
  Clause *c;
  
  c = (Clause *)malloc(0x10);
  *(undefined4 *)c = 0x202;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&c);
  return c;
}

Assistant:

static inline Clause* Reason_new(int sz) {
	auto* c = (Clause*)malloc(sizeof(Clause) + sz * sizeof(Lit));
	c->clearFlags();
	c->temp_expl = 1;
	c->sz = sz;
	sat.rtrail.last().push(c);
	return c;
}